

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O3

void __thiscall DSDcc::CRC::generate_crc_table(CRC *this)

{
  int iVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  iVar1 = this->m_refin;
  cVar6 = (char)this->m_order;
  uVar2 = this->m_crchighbit;
  uVar3 = this->m_poly;
  uVar4 = this->m_crcmask;
  uVar10 = 0;
  do {
    uVar9 = uVar10;
    if (iVar1 != 0) {
      uVar8 = 1;
      uVar9 = 0;
      uVar13 = 0x80;
      do {
        uVar11 = uVar13 & uVar10;
        if ((uVar13 & uVar10) != 0) {
          uVar11 = uVar8;
        }
        uVar9 = uVar9 | uVar11;
        uVar8 = uVar8 * 2;
        bVar5 = 1 < uVar13;
        uVar13 = uVar13 >> 1;
      } while (bVar5);
    }
    uVar9 = uVar9 << (cVar6 - 8U & 0x3f);
    iVar7 = 8;
    do {
      uVar8 = uVar2 & uVar9;
      if (uVar8 != 0) {
        uVar8 = uVar3;
      }
      uVar9 = uVar8 ^ uVar9 * 2;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    uVar8 = uVar9;
    if (iVar1 != 0) {
      uVar13 = 1;
      uVar8 = 0;
      uVar11 = 1L << (cVar6 - 1U & 0x3f);
      do {
        uVar12 = uVar11 & uVar9;
        if ((uVar11 & uVar9) != 0) {
          uVar12 = uVar13;
        }
        uVar8 = uVar8 | uVar12;
        uVar13 = uVar13 * 2;
        bVar5 = 1 < uVar11;
        uVar11 = uVar11 >> 1;
      } while (bVar5);
    }
    this->m_crctab[uVar10] = uVar8 & uVar4;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x100);
  return;
}

Assistant:

void CRC::generate_crc_table()
{
    // make CRC lookup table used by table algorithms

    int i, j;
    unsigned long bit, crc;

    for (i = 0; i < 256; i++)
    {
        crc = (unsigned long) i;

        if (m_refin)
            crc = reflect(crc, 8);

        crc <<= m_order - 8;

        for (j = 0; j < 8; j++)
        {
            bit = crc & m_crchighbit;
            crc <<= 1;

            if (bit)
                crc ^= m_poly;
        }

        if (m_refin)
            crc = reflect(crc, m_order);
        crc &= m_crcmask;
        m_crctab[i] = crc;
    }
}